

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

bool __thiscall
slang::driver::Driver::runPreprocessor
          (Driver *this,bool includeComments,bool includeDirectives,bool obfuscateIds,
          bool useFixedObfuscationSeed)

{
  try_emplace_args_t *ptVar1;
  try_emplace_args_t tVar2;
  char cVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  size_t __i;
  long lVar8;
  uint64_t uVar9;
  result_type rVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  undefined7 in_register_00000009;
  ulong uVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar14;
  locator *__s;
  SourceManager *this_00;
  undefined4 uVar15;
  slot_type *psVar16;
  ulong uVar17;
  ulong uVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar19;
  path *ctx;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar20;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar21;
  undefined1 uVar22;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar23;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *ptVar24;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *ptVar25;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  try_emplace_args_t tVar29;
  try_emplace_args_t tVar30;
  try_emplace_args_t tVar31;
  try_emplace_args_t tVar32;
  try_emplace_args_t tVar33;
  try_emplace_args_t tVar34;
  try_emplace_args_t tVar35;
  try_emplace_args_t tVar36;
  try_emplace_args_t tVar37;
  try_emplace_args_t tVar38;
  try_emplace_args_t tVar39;
  try_emplace_args_t tVar40;
  try_emplace_args_t tVar41;
  try_emplace_args_t tVar42;
  try_emplace_args_t tVar43;
  try_emplace_args_t tVar44;
  span<const_slang::Diagnostic,_18446744073709551615UL> diags;
  string_view sVar45;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string_view text;
  string_view text_00;
  flat_hash_map<std::string,_std::string> obfuscationMap;
  BumpAllocator alloc;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  value_type *elements;
  Bag optionBag;
  Diagnostics diagnostics;
  random_device dev;
  string newName;
  Preprocessor preprocessor;
  array<unsigned_int,_1248UL> seed;
  optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  rng;
  try_emplace_args_t local_5479;
  seed_seq local_5478;
  _func_result_type_void_ptr *local_5460;
  undefined4 local_5454;
  path *local_5450;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5448;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5440;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5438;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5430;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5428;
  ulong local_5420;
  path *local_5418;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5410;
  BumpAllocator local_53e0;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> local_53d0;
  undefined8 local_53b8;
  try_emplace_args_t tStack_53b0;
  try_emplace_args_t tStack_53af;
  try_emplace_args_t tStack_53ae;
  try_emplace_args_t tStack_53ad;
  try_emplace_args_t tStack_53ac;
  try_emplace_args_t tStack_53ab;
  try_emplace_args_t tStack_53aa;
  try_emplace_args_t tStack_53a9;
  undefined8 local_53a8;
  try_emplace_args_t tStack_53a0;
  try_emplace_args_t tStack_539f;
  try_emplace_args_t tStack_539e;
  try_emplace_args_t tStack_539d;
  try_emplace_args_t tStack_539c;
  try_emplace_args_t tStack_539b;
  try_emplace_args_t tStack_539a;
  try_emplace_args_t tStack_5399;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *local_5390;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_5388;
  DiagnosticEngine *local_5380;
  SyntaxPrinter local_5378;
  try_emplace_args_t local_5348;
  try_emplace_args_t tStack_5347;
  try_emplace_args_t tStack_5346;
  try_emplace_args_t tStack_5345;
  try_emplace_args_t tStack_5344;
  try_emplace_args_t tStack_5343;
  try_emplace_args_t tStack_5342;
  try_emplace_args_t tStack_5341;
  try_emplace_args_t tStack_5340;
  try_emplace_args_t tStack_533f;
  try_emplace_args_t tStack_533e;
  try_emplace_args_t tStack_533d;
  try_emplace_args_t tStack_533c;
  try_emplace_args_t tStack_533b;
  try_emplace_args_t tStack_533a;
  try_emplace_args_t tStack_5339;
  try_emplace_args_t local_5338;
  try_emplace_args_t tStack_5337;
  try_emplace_args_t tStack_5336;
  try_emplace_args_t tStack_5335;
  try_emplace_args_t tStack_5334;
  try_emplace_args_t tStack_5333;
  try_emplace_args_t tStack_5332;
  try_emplace_args_t tStack_5331;
  try_emplace_args_t tStack_5330;
  try_emplace_args_t tStack_532f;
  try_emplace_args_t tStack_532e;
  try_emplace_args_t tStack_532d;
  try_emplace_args_t tStack_532c;
  try_emplace_args_t tStack_532b;
  try_emplace_args_t tStack_532a;
  try_emplace_args_t tStack_5329;
  undefined1 local_5328 [16];
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_5318;
  undefined1 local_52e8 [248];
  undefined1 local_51f0 [16];
  path local_51e0 [124];
  undefined1 local_3e68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e58 [311];
  Preprocessor local_2ae0;
  locator local_2748 [208];
  uint local_13c8 [2];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13c0;
  char local_38;
  
  local_5454 = (undefined4)CONCAT71(in_register_00000009,obfuscateIds);
  local_5318.arrays.groups_size_index = 0x3f;
  local_5318.arrays.groups_size_mask = 1;
  local_5318.arrays.elements_ = (value_type_pointer)0x0;
  local_5318.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_5318.size_ctrl.ml = 0;
  local_5318.size_ctrl.size = 0;
  addParseOptions(this,(Bag *)&local_5318);
  BumpAllocator::BumpAllocator(&local_53e0);
  local_52e8._0_8_ = local_52e8 + 0x18;
  local_52e8._8_8_ = (pointer)0x0;
  local_52e8._16_8_ = 2;
  local_5380 = (DiagnosticEngine *)&this->sourceManager;
  local_5328 = (undefined1  [16])0x0;
  aVar20.values_ = (value<fmt::v11::context> *)&local_5318;
  parsing::Preprocessor::Preprocessor
            (&local_2ae0,(SourceManager *)local_5380,&local_53e0,(Diagnostics *)local_52e8,
             (Bag *)aVar20.values_,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  SourceLoader::loadSources(&local_53d0,&this->sourceLoader);
  for (; uVar15 = local_5454,
      local_53d0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_53d0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_start;
      local_53d0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_53d0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1) {
    parsing::Preprocessor::pushSource
              (&local_2ae0,
               local_53d0.
               super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]);
  }
  local_5378.buffer._M_dataplus._M_p = (pointer)&local_5378.buffer.field_2;
  local_5378.buffer._M_string_length = 0;
  local_5378.buffer.field_2._M_local_buf[0] = '\0';
  local_5378.sourceManager = (SourceManager *)0x0;
  local_5378.includeTrivia = true;
  local_5378.includeMissing = false;
  local_5378.includeSkipped = false;
  local_5378.includePreprocessed = true;
  local_5378.squashNewlines = true;
  local_38 = '\0';
  local_5410.arrays.groups_size_index = 0x3f;
  local_5410.arrays.groups_size_mask = 1;
  local_5410.arrays.elements_ = (value_type_pointer)0x0;
  local_5410.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_5410.size_ctrl.ml = 0;
  local_5410.size_ctrl.size = 0;
  local_5378.includeDirectives = includeDirectives;
  local_5378.includeComments = includeComments;
  if ((char)local_5454 != '\0') {
    if (useFixedObfuscationSeed) {
      local_13c0._M_x[0] = 0x1571;
      lVar8 = 1;
      uVar12 = 0x1571;
      do {
        uVar12 = (ulong)(((uint)(uVar12 >> 0x1e) ^ (uint)uVar12) * 0x6c078965 + (int)lVar8);
        local_13c0._M_x[lVar8] = uVar12;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x270);
      local_13c0._M_p = 0x270;
    }
    else {
      __s = local_2748;
      memset(__s,0,0x1380);
      std::random_device::random_device((random_device *)local_51f0);
      uVar12 = 0x4e1;
      do {
        uVar5 = std::random_device::_M_getval();
        *(undefined4 *)&__s->pg = uVar5;
        __s = (locator *)((long)&__s->pg + 4);
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
      std::seed_seq::seed_seq<unsigned_int*>(&local_5478,(uint *)local_2748,local_13c8);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed<std::seed_seq>
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)local_3e68,&local_5478);
      if (local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5478._M_v.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_5478._M_v.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5478._M_v.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::random_device::_M_fini();
      cVar3 = local_38;
      memcpy(&local_13c0,local_3e68,5000);
      if (cVar3 != '\0') goto LAB_0018db9f;
    }
    local_38 = '\x01';
  }
LAB_0018db9f:
  do {
    local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._0_16_ = parsing::Preprocessor::next(&local_2ae0);
    if ((TokenKind)
        local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == IntegerBase) {
      do {
        slang::syntax::SyntaxPrinter::print
                  (&local_5378,
                   (Token)local_5478._M_v.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._0_16_);
        local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._0_16_ = parsing::Preprocessor::next(&local_2ae0);
        bVar4 = slang::syntax::SyntaxFacts::isPossibleVectorDigit
                          ((TokenKind)
                           local_5478._M_v.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start);
      } while (bVar4);
    }
    if (((char)uVar15 != '\0') &&
       ((TokenKind)
        local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == Identifier)) {
      sVar45 = parsing::Token::valueText((Token *)&local_5478);
      local_51f0._0_8_ = local_51e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_51f0,sVar45._M_str,sVar45._M_str + sVar45._M_len);
      local_5450 = (path *)local_51f0._0_8_;
      local_5460 = (_func_result_type_void_ptr *)local_51f0._8_8_;
      uVar9 = detail::hashing::hash((void *)local_51f0._0_8_,local_51f0._8_8_);
      uVar17 = uVar9 >> ((byte)local_5410.arrays.groups_size_index & 0x3f);
      lVar8 = (uVar9 & 0xff) * 4;
      tVar29 = *(try_emplace_args_t *)(&UNK_0047072c + lVar8);
      tVar30 = *(try_emplace_args_t *)(&UNK_0047072d + lVar8);
      tVar31 = *(try_emplace_args_t *)(&UNK_0047072e + lVar8);
      tVar32 = *(try_emplace_args_t *)(&UNK_0047072f + lVar8);
      uVar12 = (ulong)((uint)uVar9 & 7);
      aVar19.values_ = (value<fmt::v11::context> *)0x0;
      aVar13 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_5410.arrays.elements_;
      aVar20 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_5410.arrays.groups_;
      aVar11 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_5410.arrays.groups_size_mask;
      tVar33 = tVar29;
      tVar34 = tVar30;
      tVar35 = tVar31;
      tVar36 = tVar32;
      tVar37 = tVar29;
      tVar38 = tVar30;
      tVar39 = tVar31;
      tVar40 = tVar32;
      tVar41 = tVar29;
      tVar42 = tVar30;
      tVar43 = tVar31;
      tVar44 = tVar32;
      do {
        ptVar1 = (try_emplace_args_t *)(aVar20.values_ + uVar17);
        local_5338 = *ptVar1;
        tStack_5337 = ptVar1[1];
        tStack_5336 = ptVar1[2];
        tStack_5335 = ptVar1[3];
        tStack_5334 = ptVar1[4];
        tStack_5333 = ptVar1[5];
        tStack_5332 = ptVar1[6];
        tStack_5331 = ptVar1[7];
        tStack_5330 = ptVar1[8];
        tStack_532f = ptVar1[9];
        tStack_532e = ptVar1[10];
        tStack_532d = ptVar1[0xb];
        tStack_532c = ptVar1[0xc];
        tStack_532b = ptVar1[0xd];
        tStack_532a = ptVar1[0xe];
        tStack_5329 = ptVar1[0xf];
        auVar27[0] = -(local_5338 == tVar29);
        auVar27[1] = -(tStack_5337 == tVar30);
        auVar27[2] = -(tStack_5336 == tVar31);
        auVar27[3] = -(tStack_5335 == tVar32);
        auVar27[4] = -(tStack_5334 == tVar33);
        auVar27[5] = -(tStack_5333 == tVar34);
        auVar27[6] = -(tStack_5332 == tVar35);
        auVar27[7] = -(tStack_5331 == tVar36);
        auVar27[8] = -(tStack_5330 == tVar37);
        auVar27[9] = -(tStack_532f == tVar38);
        auVar27[10] = -(tStack_532e == tVar39);
        auVar27[0xb] = -(tStack_532d == tVar40);
        auVar27[0xc] = -(tStack_532c == tVar41);
        auVar27[0xd] = -(tStack_532b == tVar42);
        auVar27[0xe] = -(tStack_532a == tVar43);
        auVar27[0xf] = -(tStack_5329 == tVar44);
        uVar7 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
        aVar14 = aVar13;
        uVar18 = uVar17;
        aVar21 = aVar19;
        uVar22 = tStack_5329;
        if (uVar7 != 0) {
          local_5448._0_1_ = tStack_5329;
          local_5440 = aVar19;
          local_5438 = aVar11;
          local_5430 = aVar13;
          local_5428 = aVar20;
          local_5420 = uVar17;
          local_53b8 = uVar12;
          do {
            local_5418 = (path *)(ulong)uVar7;
            iVar6 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
              }
            }
            if (local_5460 ==
                *(_func_result_type_void_ptr **)
                 ((try_emplace_args_t *)(aVar13.values_ + uVar17 * 0x3c) +
                 (ulong)(uint)(iVar6 << 6) + 8)) {
              ppVar26 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((try_emplace_args_t *)(aVar13.values_ + uVar17 * 0x3c) +
                           (uint)(iVar6 << 6));
              aVar20 = local_5438;
              in_R9 = local_5440;
              if (local_5460 == (_func_result_type_void_ptr *)0x0) goto LAB_0018e0ae;
              local_53a8._1_1_ = tVar30;
              local_53a8._0_1_ = tVar29;
              local_53a8._2_1_ = tVar31;
              local_53a8._3_1_ = tVar32;
              local_53a8._4_1_ = tVar33;
              local_53a8._5_1_ = tVar34;
              local_53a8._6_1_ = tVar35;
              local_53a8._7_1_ = tVar36;
              tStack_53a0 = tVar37;
              tStack_539f = tVar38;
              tStack_539e = tVar39;
              tStack_539d = tVar40;
              tStack_539c = tVar41;
              tStack_539b = tVar42;
              tStack_539a = tVar43;
              tStack_5399 = tVar44;
              iVar6 = bcmp(local_5450,(ppVar26->first)._M_dataplus._M_p,(size_t)local_5460);
              tVar29 = (try_emplace_args_t)(undefined1)local_53a8;
              tVar30 = (try_emplace_args_t)local_53a8._1_1_;
              tVar31 = (try_emplace_args_t)local_53a8._2_1_;
              tVar32 = (try_emplace_args_t)local_53a8._3_1_;
              tVar33 = (try_emplace_args_t)local_53a8._4_1_;
              tVar34 = (try_emplace_args_t)local_53a8._5_1_;
              tVar35 = (try_emplace_args_t)local_53a8._6_1_;
              tVar36 = (try_emplace_args_t)local_53a8._7_1_;
              tVar37 = tStack_53a0;
              tVar38 = tStack_539f;
              tVar39 = tStack_539e;
              tVar40 = tStack_539d;
              tVar41 = tStack_539c;
              tVar42 = tStack_539b;
              tVar43 = tStack_539a;
              tVar44 = tStack_5399;
              if (iVar6 == 0) goto LAB_0018e0ae;
            }
            uVar7 = (uint)local_5418 - 1 & (uint)local_5418;
            aVar14 = local_5430;
            uVar12 = local_53b8;
            uVar18 = local_5420;
            aVar20 = local_5428;
            aVar11 = local_5438;
            aVar21 = local_5440;
            uVar22 = local_5448._0_1_;
          } while (uVar7 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar12] & uVar22) == 0) break;
        aVar19.values_ = (value<fmt::v11::context> *)((long)&(aVar21.values_)->field_0 + 1);
        uVar17 = (ulong)((long)&(aVar21.values_)->field_0 + uVar18 + 1) & (ulong)aVar11.values_;
        aVar13 = aVar14;
      } while (aVar19.values_ <= aVar11.values_);
      local_3e68._0_8_ = local_3e68 + 0x10;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e68,
                 0x10,'\0');
      uVar12 = 0x11;
      psVar16 = (slot_type *)local_3e68._0_8_;
      do {
        rVar10 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()(&local_13c0);
        psVar16->n = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar10 % 0x3e]
        ;
        psVar16 = psVar16 + 1;
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
      local_5418 = (path *)local_51f0._0_8_;
      local_5460 = (_func_result_type_void_ptr *)local_51f0._8_8_;
      aVar11 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               detail::hashing::hash((void *)local_51f0._0_8_,local_51f0._8_8_);
      aVar21.values_ =
           (value<fmt::v11::context> *)
           ((ulong)aVar11.values_ >> ((byte)local_5410.arrays.groups_size_index & 0x3f));
      lVar8 = ((ulong)aVar11.values_ & 0xff) * 4;
      tVar29 = *(try_emplace_args_t *)(&UNK_0047072c + lVar8);
      tVar30 = *(try_emplace_args_t *)(&UNK_0047072d + lVar8);
      tVar31 = *(try_emplace_args_t *)(&UNK_0047072e + lVar8);
      tVar32 = *(try_emplace_args_t *)(&UNK_0047072f + lVar8);
      local_53a8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                   local_5410.arrays.elements_;
      aVar19._0_4_ = aVar11._0_4_ & 7;
      aVar19._4_4_ = 0;
      ptVar24 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)0x0;
      aVar13 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_5410.arrays.groups_;
      aVar14 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_5410.arrays.groups_size_mask;
      aVar23.values_ = aVar21.values_;
      tVar33 = tVar29;
      tVar34 = tVar30;
      tVar35 = tVar31;
      tVar36 = tVar32;
      tVar37 = tVar29;
      tVar38 = tVar30;
      tVar39 = tVar31;
      tVar40 = tVar32;
      tVar41 = tVar29;
      tVar42 = tVar30;
      tVar43 = tVar31;
      tVar44 = tVar32;
      do {
        ptVar1 = (try_emplace_args_t *)(aVar13.values_ + (long)aVar23);
        local_5348 = *ptVar1;
        tStack_5347 = ptVar1[1];
        tStack_5346 = ptVar1[2];
        tStack_5345 = ptVar1[3];
        tStack_5344 = ptVar1[4];
        tStack_5343 = ptVar1[5];
        tStack_5342 = ptVar1[6];
        tStack_5341 = ptVar1[7];
        tStack_5340 = ptVar1[8];
        tStack_533f = ptVar1[9];
        tStack_533e = ptVar1[10];
        tStack_533d = ptVar1[0xb];
        tStack_533c = ptVar1[0xc];
        tStack_533b = ptVar1[0xd];
        tStack_533a = ptVar1[0xe];
        tVar2 = ptVar1[0xf];
        auVar28[0] = -(local_5348 == tVar29);
        auVar28[1] = -(tStack_5347 == tVar30);
        auVar28[2] = -(tStack_5346 == tVar31);
        auVar28[3] = -(tStack_5345 == tVar32);
        auVar28[4] = -(tStack_5344 == tVar33);
        auVar28[5] = -(tStack_5343 == tVar34);
        auVar28[6] = -(tStack_5342 == tVar35);
        auVar28[7] = -(tStack_5341 == tVar36);
        auVar28[8] = -(tStack_5340 == tVar37);
        auVar28[9] = -(tStack_533f == tVar38);
        auVar28[10] = -(tStack_533e == tVar39);
        auVar28[0xb] = -(tStack_533d == tVar40);
        auVar28[0xc] = -(tStack_533c == tVar41);
        auVar28[0xd] = -(tStack_533b == tVar42);
        auVar28[0xe] = -(tStack_533a == tVar43);
        auVar28[0xf] = -(tVar2 == tVar44);
        uVar7 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
        ptVar25 = ptVar24;
        tStack_5339 = tVar2;
        if (uVar7 != 0) {
          local_5450 = (path *)(local_53a8 + (long)aVar23.values_ * 0x3c);
          aVar20 = local_53a8;
          local_5448 = aVar14;
          local_5440 = aVar19;
          local_5438 = aVar13;
          local_5430 = aVar21;
          local_5428 = aVar11;
          local_5390 = ptVar24;
          local_5388 = aVar23;
          do {
            local_5420 = (ulong)uVar7;
            iVar6 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
              }
            }
            if (local_5460 ==
                *(_func_result_type_void_ptr **)
                 ((long)&(local_5450->_M_pathname)._M_string_length + (ulong)(uint)(iVar6 << 6))) {
              ppVar26 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)&(local_5450->_M_pathname)._M_dataplus._M_p +
                           (ulong)(uint)(iVar6 << 6));
              in_R9 = local_5430;
              if (local_5460 == (_func_result_type_void_ptr *)0x0) goto LAB_0018e089;
              local_53b8 = CONCAT17(tVar36,CONCAT16(tVar35,CONCAT15(tVar34,CONCAT14(tVar33,CONCAT13(
                                                  tVar32,CONCAT12(tVar31,CONCAT11(tVar30,tVar29)))))
                                                  ));
              tStack_53b0 = tVar37;
              tStack_53af = tVar38;
              tStack_53ae = tVar39;
              tStack_53ad = tVar40;
              tStack_53ac = tVar41;
              tStack_53ab = tVar42;
              tStack_53aa = tVar43;
              tStack_53a9 = tVar44;
              iVar6 = bcmp(local_5418,(ppVar26->first)._M_dataplus._M_p,(size_t)local_5460);
              tVar29 = local_53b8._0_1_;
              tVar30 = local_53b8._1_1_;
              tVar31 = local_53b8._2_1_;
              tVar32 = local_53b8._3_1_;
              tVar33 = local_53b8._4_1_;
              tVar34 = local_53b8._5_1_;
              tVar35 = local_53b8._6_1_;
              tVar36 = local_53b8._7_1_;
              tVar37 = tStack_53b0;
              tVar38 = tStack_53af;
              tVar39 = tStack_53ae;
              tVar40 = tStack_53ad;
              tVar41 = tStack_53ac;
              tVar42 = tStack_53ab;
              tVar43 = tStack_53aa;
              tVar44 = tStack_53a9;
              if (iVar6 == 0) goto LAB_0018e089;
            }
            uVar7 = (uint)local_5420 - 1 & (uint)local_5420;
            aVar13 = local_5438;
            aVar11 = local_5428;
            aVar19 = local_5440;
            aVar14 = local_5448;
            aVar21 = local_5430;
            aVar23 = local_5388;
            ptVar25 = local_5390;
          } while (uVar7 != 0);
        }
        if ((*(byte *)&(((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                          *)(aVar19.values_ + 0x470b2))->arrays).groups_size_index & (byte)tVar2) ==
            0) break;
        ptVar24 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)((long)&(ptVar25->arrays).groups_size_index + 1);
        aVar23.args_ = (ulong)((long)&(aVar23.values_)->field_0 +
                              (long)((long)&(ptVar25->arrays).groups_size_index + 1)) & aVar14.args_
        ;
      } while (ptVar24 <= aVar14.values_);
      if (local_5410.size_ctrl.size < local_5410.size_ctrl.ml) {
        in_R9.values_ = (value<fmt::v11::context> *)&local_5479;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                  (local_2748,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_5410,&local_5410.arrays,(size_t)aVar21,(size_t)aVar11,
                   (try_emplace_args_t *)in_R9.values_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e68);
        local_5410.size_ctrl.size = local_5410.size_ctrl.size + 1;
        aVar20 = aVar11;
        ppVar26 = local_2748[0].p;
      }
      else {
        aVar20.values_ = (value<fmt::v11::context> *)local_51f0;
        in_R9.values_ = (value<fmt::v11::context> *)local_3e68;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                  (local_2748,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_5410,(size_t)aVar11,&local_5479,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   aVar20.values_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_R9.values_);
        ppVar26 = local_2748[0].p;
      }
LAB_0018e089:
      if ((group15<boost::unordered::detail::foa::plain_integral> *)local_3e68._0_8_ !=
          (group15<boost::unordered::detail::foa::plain_integral> *)(local_3e68 + 0x10)) {
        operator_delete((void *)local_3e68._0_8_,local_3e58[0]._M_allocated_capacity + 1);
      }
LAB_0018e0ae:
      sVar45._M_str = (ppVar26->second)._M_dataplus._M_p;
      sVar45._M_len = (ppVar26->second)._M_string_length;
      local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._0_16_ =
           parsing::Token::withRawText((Token *)&local_5478,&local_53e0,sVar45);
      uVar15 = local_5454;
      if ((path *)local_51f0._0_8_ != local_51e0) {
        operator_delete((void *)local_51f0._0_8_,
                        (long)local_51e0[0]._M_pathname._M_dataplus._M_p + 1);
      }
    }
    slang::syntax::SyntaxPrinter::print
              (&local_5378,
               (Token)local_5478._M_v.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._0_16_);
  } while ((TokenKind)
           local_5478._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start != EndOfFile);
  if ((pointer)local_52e8._8_8_ != (pointer)0x0) {
    lVar8 = local_52e8._8_8_ * 0x70;
    this_00 = (SourceManager *)local_52e8._0_8_;
    do {
      bVar4 = Diagnostic::isError((Diagnostic *)this_00);
      if (bVar4) {
        diags._M_extent._M_extent_value = (size_t)aVar20.values_;
        diags._M_ptr = (pointer)local_52e8._8_8_;
        DiagnosticEngine::reportAll_abi_cxx11_
                  ((string *)local_3e68,local_5380,(SourceManager *)local_52e8._0_8_,diags);
        local_2748[0].pg =
             (group15<boost::unordered::detail::foa::plain_integral> *)local_3e68._0_8_;
        local_2748[0]._8_8_ = local_3e68._8_8_;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x2;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_2748;
        ::fmt::v11::vformat_abi_cxx11_((string *)local_51f0,(v11 *)0x496aa5,fmt_00,args_00);
        text_00._M_str = (char *)local_51f0._0_8_;
        text_00._M_len = local_51f0._8_8_;
        ctx = (path *)local_51f0._0_8_;
        OS::printE(text_00);
        if ((path *)local_51f0._0_8_ != local_51e0) {
          ctx = (path *)((long)local_51e0[0]._M_pathname._M_dataplus._M_p + 1);
          operator_delete((void *)local_51f0._0_8_,(size_t)ctx);
        }
        if ((group15<boost::unordered::detail::foa::plain_integral> *)local_3e68._0_8_ !=
            (group15<boost::unordered::detail::foa::plain_integral> *)(local_3e68 + 0x10)) {
          ctx = (path *)(local_3e58[0]._M_allocated_capacity + 1);
          operator_delete((void *)local_3e68._0_8_,(size_t)ctx);
        }
        bVar4 = false;
        goto LAB_0018e2ed;
      }
      this_00 = (SourceManager *)&this_00->bufferEntries;
      lVar8 = lVar8 + -0x70;
    } while (lVar8 != 0);
  }
  local_3e68._0_8_ = local_3e68 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e68,local_5378.buffer._M_dataplus._M_p,
             local_5378.buffer._M_dataplus._M_p + local_5378.buffer._M_string_length);
  local_2748[0].pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_3e68._0_8_;
  local_2748[0]._8_8_ = local_3e68._8_8_;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x3;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_2748;
  ::fmt::v11::vformat_abi_cxx11_((string *)local_51f0,(v11 *)0x472ba3,fmt,args);
  text._M_str = (char *)local_51f0._0_8_;
  text._M_len = local_51f0._8_8_;
  ctx = (path *)local_51f0._0_8_;
  OS::print(text);
  if ((path *)local_51f0._0_8_ != local_51e0) {
    ctx = (path *)((long)local_51e0[0]._M_pathname._M_dataplus._M_p + 1);
    operator_delete((void *)local_51f0._0_8_,(size_t)ctx);
  }
  if ((group15<boost::unordered::detail::foa::plain_integral> *)local_3e68._0_8_ !=
      (group15<boost::unordered::detail::foa::plain_integral> *)(local_3e68 + 0x10)) {
    ctx = (path *)(local_3e58[0]._M_allocated_capacity + 1);
    operator_delete((void *)local_3e68._0_8_,(size_t)ctx);
  }
  bVar4 = true;
LAB_0018e2ed:
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~table_core(&local_5410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5378.buffer._M_dataplus._M_p != &local_5378.buffer.field_2) {
    ctx = (path *)(CONCAT71(local_5378.buffer.field_2._M_allocated_capacity._1_7_,
                            local_5378.buffer.field_2._M_local_buf[0]) + 1);
    operator_delete(local_5378.buffer._M_dataplus._M_p,(size_t)ctx);
  }
  if (local_53d0.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ctx = (path *)((long)local_53d0.
                         super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_53d0.
                        super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_53d0.
                    super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                    _M_impl.super__Vector_impl_data._M_start,(size_t)ctx);
  }
  parsing::Preprocessor::~Preprocessor(&local_2ae0);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)local_52e8,(EVP_PKEY_CTX *)ctx);
  BumpAllocator::~BumpAllocator(&local_53e0);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_5318);
  return bVar4;
}

Assistant:

bool Driver::runPreprocessor(bool includeComments, bool includeDirectives, bool obfuscateIds,
                             bool useFixedObfuscationSeed) {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    SyntaxPrinter output;
    output.setIncludeComments(includeComments);
    output.setIncludeDirectives(includeDirectives);

    std::optional<std::mt19937> rng;
    flat_hash_map<std::string, std::string> obfuscationMap;

    if (obfuscateIds) {
        if (useFixedObfuscationSeed)
            rng.emplace();
        else
            rng = createRandomGenerator<std::mt19937>();
    }

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::IntegerBase) {
            // This is needed for the case where obfuscation is enabled,
            // the digits of a vector literal may be lexed initially as
            // an identifier and we don't have the parser here to fix things
            // up for us.
            do {
                output.print(token);
                token = preprocessor.next();
            } while (SyntaxFacts::isPossibleVectorDigit(token.kind));
        }

        if (obfuscateIds && token.kind == TokenKind::Identifier) {
            auto name = std::string(token.valueText());
            auto translation = obfuscationMap.find(name);
            if (translation == obfuscationMap.end()) {
                auto newName = generateRandomAlphanumericString(*rng, 16);
                translation = obfuscationMap.emplace(name, newName).first;
            }
            token = token.withRawText(alloc, translation->second);
        }

        output.print(token);
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    // Only print diagnostics if actual errors occurred.
    for (auto& diag : diagnostics) {
        if (diag.isError()) {
            OS::printE(fmt::format("{}", DiagnosticEngine::reportAll(sourceManager, diagnostics)));
            return false;
        }
    }

    OS::print(fmt::format("{}\n", output.str()));
    return true;
}